

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.hpp
# Opt level: O2

String * __thiscall
Diligent::GetShaderResourcePrintName_abi_cxx11_
          (String *__return_storage_ptr__,Diligent *this,char *Name,Uint32 ArraySize,
          Uint32 ArrayIndex)

{
  string msg;
  
  if ((uint)Name <= ArraySize) {
    FormatString<char[28]>(&msg,(char (*) [28])"Array index is out of range");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetShaderResourcePrintName",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/GraphicsAccessories.hpp"
               ,0x323);
    std::__cxx11::string::~string((string *)&msg);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)this,(allocator *)&msg);
  if (1 < (uint)Name) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    std::__cxx11::to_string(&msg,ArraySize);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&msg);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

inline String GetShaderResourcePrintName(const char* Name, Uint32 ArraySize, Uint32 ArrayIndex)
{
    VERIFY(ArrayIndex < ArraySize, "Array index is out of range");
    String PrintName = Name;
    if (ArraySize > 1)
    {
        PrintName.push_back('[');
        PrintName.append(std::to_string(ArrayIndex));
        PrintName.push_back(']');
    }
    return PrintName;
}